

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.cpp
# Opt level: O1

OperatorResultType
duckdb::RangeFunction<false>
          (ExecutionContext *context,TableFunctionInput *data_p,DataChunk *input,DataChunk *output)

{
  hugeint_t *start;
  hugeint_t *end_00;
  hugeint_t *increment_00;
  LocalTableFunctionState *pLVar1;
  _func_int **pp_Var2;
  unsigned_long *puVar3;
  undefined1 auVar4 [16];
  DataChunk *pDVar5;
  hugeint_t *phVar6;
  int64_t start_00;
  reference pvVar7;
  InternalException *this;
  BinderException *this_00;
  byte bVar8;
  hugeint_t *result;
  int64_t *result_00;
  size_type sVar9;
  hugeint_t *count;
  idx_t entry_idx;
  idx_t value_count;
  LocalTableFunctionState *pLVar10;
  bool bVar11;
  hugeint_t hVar12;
  hugeint_t input_00;
  hugeint_t input_01;
  hugeint_t increment;
  int64_t current_value_i64;
  hugeint_t current_value;
  hugeint_t end;
  string local_e8;
  hugeint_t local_c0;
  LocalTableFunctionState *local_b0;
  DataChunk *local_a8;
  hugeint_t *local_a0;
  hugeint_t local_98;
  Vector *local_88;
  int64_t local_80;
  hugeint_t local_78;
  hugeint_t local_68;
  hugeint_t local_58;
  hugeint_t local_40;
  
  local_a8 = output;
  optional_ptr<duckdb::LocalTableFunctionState,_true>::CheckValid(&data_p->local_state);
  pLVar1 = (data_p->local_state).ptr;
  start = (hugeint_t *)(pLVar1 + 4);
  end_00 = (hugeint_t *)(pLVar1 + 6);
  increment_00 = (hugeint_t *)(pLVar1 + 8);
  result = start;
  pLVar10 = pLVar1;
  local_b0 = pLVar1;
  do {
    if (*(char *)&pLVar10[1]._vptr_LocalTableFunctionState == '\0') {
      pp_Var2 = pLVar10[2]._vptr_LocalTableFunctionState;
      if ((_func_int **)input->count <= pp_Var2) {
        pLVar10[2]._vptr_LocalTableFunctionState = (_func_int **)0x0;
        *(undefined1 *)&pLVar10[1]._vptr_LocalTableFunctionState = 0;
        return NEED_MORE_INPUT;
      }
      DataChunk::Flatten(input);
      if ((input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
          super__Vector_impl_data._M_start) {
        result = (hugeint_t *)((ulong)pp_Var2 & 0xffffffff);
        bVar8 = (byte)result;
        bVar11 = true;
        sVar9 = 0;
        do {
          pvVar7 = vector<duckdb::Vector,_true>::operator[](&input->data,sVar9);
          puVar3 = (pvVar7->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if ((puVar3 != (unsigned_long *)0x0) &&
             ((puVar3[(ulong)pp_Var2 >> 6] & 1L << (bVar8 & 0x3f)) == 0)) {
            hugeint_t::hugeint_t((hugeint_t *)&local_e8,0);
            start->lower = (uint64_t)local_e8._M_dataplus._M_p;
            pLVar1[5]._vptr_LocalTableFunctionState = (_func_int **)local_e8._M_string_length;
            hugeint_t::hugeint_t((hugeint_t *)&local_e8,0);
            end_00->lower = (uint64_t)local_e8._M_dataplus._M_p;
            pLVar1[7]._vptr_LocalTableFunctionState = (_func_int **)local_e8._M_string_length;
            hugeint_t::hugeint_t((hugeint_t *)&local_e8,1);
            increment_00->lower = (uint64_t)local_e8._M_dataplus._M_p;
            pLVar1[9]._vptr_LocalTableFunctionState = (_func_int **)local_e8._M_string_length;
            if (bVar11) goto LAB_01555d5e;
            break;
          }
          sVar9 = sVar9 + 1;
          result = (hugeint_t *)0x4ec4ec4ec4ec4ec5;
          bVar11 = sVar9 < (ulong)(((long)(input->data).
                                          super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                          .
                                          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(input->data).
                                          super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                          .
                                          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                  0x4ec4ec4ec4ec4ec5);
        } while (bVar11);
      }
      if ((input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          (input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
          super__Vector_impl_data._M_start) {
        value_count = 0;
      }
      else {
        sVar9 = 0;
        do {
          if (sVar9 == 3) {
            this = (InternalException *)__cxa_allocate_exception(0x10);
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_e8,"Unsupported parameter count for range function","");
            InternalException::InternalException(this,&local_e8);
            __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          pvVar7 = vector<duckdb::Vector,_true>::operator[](&input->data,sVar9);
          (&local_58.lower)[sVar9] = *(uint64_t *)(pvVar7->data + (long)pp_Var2 * 8);
          sVar9 = sVar9 + 1;
          value_count = ((long)(input->data).
                               super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(input->data).
                               super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5;
        } while (sVar9 < value_count);
      }
      result = end_00;
      GetParameters((int64_t *)&local_58,value_count,start,end_00,increment_00);
      hugeint_t::hugeint_t((hugeint_t *)&local_e8,0);
      bVar11 = hugeint_t::operator==(increment_00,(hugeint_t *)&local_e8);
      if (bVar11) {
        this_00 = (BinderException *)__cxa_allocate_exception(0x10);
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_e8,"interval cannot be 0!","");
        BinderException::BinderException(this_00,&local_e8);
        __cxa_throw(this_00,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      bVar11 = hugeint_t::operator>(start,end_00);
      pLVar10 = local_b0;
      if (bVar11) {
        hugeint_t::hugeint_t((hugeint_t *)&local_e8,0);
        bVar11 = hugeint_t::operator>(increment_00,(hugeint_t *)&local_e8);
        if (bVar11) {
          *(undefined1 *)&pLVar10[10]._vptr_LocalTableFunctionState = 1;
        }
      }
      bVar11 = hugeint_t::operator<(start,end_00);
      if (bVar11) {
        hugeint_t::hugeint_t((hugeint_t *)&local_e8,0);
        bVar11 = hugeint_t::operator<(increment_00,(hugeint_t *)&local_e8);
        if (bVar11) {
          *(undefined1 *)&pLVar10[10]._vptr_LocalTableFunctionState = 1;
        }
      }
LAB_01555d5e:
      *(undefined1 *)&local_b0[1]._vptr_LocalTableFunctionState = 1;
      local_b0[3]._vptr_LocalTableFunctionState = (_func_int **)0x0;
      pLVar10 = local_b0;
    }
    if (*(char *)&pLVar10[10]._vptr_LocalTableFunctionState == '\x01') {
      local_a8->count = 0;
      pLVar10[2]._vptr_LocalTableFunctionState =
           (_func_int **)((long)pLVar10[2]._vptr_LocalTableFunctionState + 1);
      *(undefined1 *)&pLVar10[1]._vptr_LocalTableFunctionState = 0;
      return HAVE_MORE_OUTPUT;
    }
    local_e8._M_dataplus._M_p = (pointer)increment_00->lower;
    local_e8._M_string_length = (size_type)pLVar1[9]._vptr_LocalTableFunctionState;
    local_58.lower = end_00->lower;
    local_58.upper = (int64_t)pLVar1[7]._vptr_LocalTableFunctionState;
    hugeint_t::hugeint_t(&local_98,(int64_t)pLVar10[3]._vptr_LocalTableFunctionState);
    local_c0 = hugeint_t::operator*((hugeint_t *)&local_e8,&local_98);
    local_68 = hugeint_t::operator+(start,&local_c0);
    hVar12.upper = (int64_t)&local_80;
    hVar12.lower = local_68.upper;
    bVar11 = Hugeint::TryCast<long>((Hugeint *)local_68.lower,hVar12,(int64_t *)result);
    if (bVar11) {
      hugeint_t::hugeint_t(&local_c0,0);
      bVar11 = hugeint_t::operator<((hugeint_t *)&local_e8,&local_c0);
      local_98 = hugeint_t::operator-(&local_58,&local_68);
      hugeint_t::hugeint_t(&local_40,(ulong)bVar11 - 1 | 1);
      local_78 = hugeint_t::operator+((hugeint_t *)&local_e8,&local_40);
      local_c0 = hugeint_t::operator+(&local_98,&local_78);
      hVar12 = hugeint_t::operator/(&local_c0,(hugeint_t *)&local_e8);
      result_00 = (int64_t *)0x0;
      local_a0 = (hugeint_t *)0x0;
      input_00.upper = (int64_t)&local_a0;
      input_00.lower = hVar12.upper;
      Hugeint::TryCast<unsigned_long>((Hugeint *)hVar12.lower,input_00,(uint64_t *)0x0);
      phVar6 = local_a0;
      pDVar5 = local_a8;
      count = (hugeint_t *)0x800;
      if (local_a0 < (hugeint_t *)0x800) {
        count = local_a0;
      }
      local_88 = vector<duckdb::Vector,_true>::operator[](&local_a8->data,0);
      start_00 = local_80;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = local_c0.upper;
      local_c0 = (hugeint_t)(auVar4 << 0x40);
      input_01.upper = (int64_t)&local_c0;
      input_01.lower = local_e8._M_string_length;
      Hugeint::TryCast<long>((Hugeint *)local_e8._M_dataplus._M_p,input_01,result_00);
      pLVar10 = local_b0;
      result = count;
      Vector::Sequence(local_88,start_00,local_c0.lower,(idx_t)count);
      pLVar10[3]._vptr_LocalTableFunctionState =
           (_func_int **)((long)pLVar10[3]._vptr_LocalTableFunctionState + (long)count);
      pDVar5->count = (idx_t)count;
      if (phVar6 != (hugeint_t *)0x0) {
        return HAVE_MORE_OUTPUT;
      }
      pLVar10[2]._vptr_LocalTableFunctionState =
           (_func_int **)((long)pLVar10[2]._vptr_LocalTableFunctionState + 1);
      *(undefined1 *)&pLVar10[1]._vptr_LocalTableFunctionState = 0;
    }
    else {
      pLVar10[2]._vptr_LocalTableFunctionState =
           (_func_int **)((long)pLVar10[2]._vptr_LocalTableFunctionState + 1);
      *(undefined1 *)&pLVar10[1]._vptr_LocalTableFunctionState = 0;
    }
  } while( true );
}

Assistant:

static OperatorResultType RangeFunction(ExecutionContext &context, TableFunctionInput &data_p, DataChunk &input,
                                        DataChunk &output) {
	auto &state = data_p.local_state->Cast<RangeFunctionLocalState>();
	while (true) {
		if (!state.initialized_row) {
			// initialize for the current input row
			if (state.current_input_row >= input.size()) {
				// ran out of rows
				state.current_input_row = 0;
				state.initialized_row = false;
				return OperatorResultType::NEED_MORE_INPUT;
			}
			GenerateRangeParameters<GENERATE_SERIES>(input, state.current_input_row, state);
			state.initialized_row = true;
			state.current_idx = 0;
		}
		if (state.empty_range) {
			// empty range
			output.SetCardinality(0);
			state.current_input_row++;
			state.initialized_row = false;
			return OperatorResultType::HAVE_MORE_OUTPUT;
		}
		auto increment = state.increment;
		auto end = state.end;
		hugeint_t current_value = state.start + increment * UnsafeNumericCast<int64_t>(state.current_idx);
		int64_t current_value_i64;
		if (!Hugeint::TryCast<int64_t>(current_value, current_value_i64)) {
			// move to next row
			state.current_input_row++;
			state.initialized_row = false;
			continue;
		}
		int64_t offset = increment < 0 ? 1 : -1;
		idx_t remaining = MinValue<idx_t>(
		    Hugeint::Cast<idx_t>((end - current_value + (increment + offset)) / increment), STANDARD_VECTOR_SIZE);
		// set the result vector as a sequence vector
		output.data[0].Sequence(current_value_i64, Hugeint::Cast<int64_t>(increment), remaining);
		// increment the index pointer by the remaining count
		state.current_idx += remaining;
		output.SetCardinality(remaining);
		if (remaining == 0) {
			// move to next row
			state.current_input_row++;
			state.initialized_row = false;
			continue;
		}
		return OperatorResultType::HAVE_MORE_OUTPUT;
	}
}